

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cConditionalRenderInvertedTests.cpp
# Opt level: O3

IterateResult __thiscall
gl4cts::ConditionalRenderInverted::FunctionalTest::iterate(FunctionalTest *this)

{
  ostringstream *poVar1;
  GLenum condition_mode_or_query_target;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  ContextType ctxType;
  int iVar7;
  deUint32 err;
  undefined4 extraout_var;
  size_t sVar8;
  undefined4 extraout_var_00;
  char *pcVar9;
  char *pcVar10;
  qpTestResult testResult;
  TestContext *this_00;
  uint uVar11;
  long lVar12;
  GLfloat GVar13;
  float fVar14;
  float fVar15;
  float local_1d8;
  long local_1c8;
  long local_1c0;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar3 = glu::contextSupports(ctxType,(ApiType)0x154);
  bVar4 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,
                     "GL_ARB_conditional_render_inverted");
  if ((bVar3) || (bVar4)) {
    createProgram(this);
    createView(this);
    createVertexArrayObject(this);
    local_1c8 = 0;
    bVar4 = true;
    bVar3 = true;
    do {
      bVar5 = bVar3;
      bVar6 = false;
      local_1c0 = 0;
      bVar3 = true;
      do {
        bVar2 = bVar3;
        pcVar9 = "unknow mode";
        if (bVar2) {
          pcVar9 = "GL_SAMPLES_PASSED";
        }
        if (bVar6) {
          pcVar9 = "GL_ANY_SAMPLES_PASSED";
        }
        lVar12 = 0;
        do {
          createQueryObject(this);
          setupColor(this,1.0);
          bVar3 = iterate::render_cases[local_1c8];
          setupPassSwitch(this,bVar3);
          iVar7 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
          (**(code **)(CONCAT44(extraout_var,iVar7) + 0x188))(0x4000);
          err = (**(code **)(CONCAT44(extraout_var,iVar7) + 0x800))();
          glu::checkError(err,"glClear() call failed.",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cConditionalRenderInvertedTests.cpp"
                          ,0x2ba);
          draw(this,false,iterate::query_cases[local_1c0]);
          bVar6 = fragmentsPassed(this);
          if (bVar3 == bVar6) {
            setupColor(this,0.0);
            setupPassSwitch(this,true);
            condition_mode_or_query_target =
                 *(GLenum *)((long)CoverageTest::iterate::modes + lVar12);
            draw(this,true,condition_mode_or_query_target);
            local_1d8 = 1.0;
            if (bVar3 == false) {
              local_1d8 = 0.0;
            }
            GVar13 = readPixel(this);
            fVar15 = local_1d8 - GVar13;
            fVar14 = -fVar15;
            if (-fVar15 <= fVar15) {
              fVar14 = fVar15;
            }
            if (0.0078125 < fVar14) {
              local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
              poVar1 = (ostringstream *)(local_1b0 + 8);
              std::__cxx11::ostringstream::ostringstream(poVar1);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar1,"The functional test\'s expected value (",0x26);
              std::ostream::_M_insert<double>((double)local_1d8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar1,") is different than resulted value (",0x24);
              std::ostream::_M_insert<double>((double)GVar13);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar1,"). The tested mode was ",0x17);
              uVar11 = condition_mode_or_query_target - 0x8e17;
              pcVar10 = "unknow mode";
              if (uVar11 < 4) {
                pcVar10 = (&PTR_anon_var_dwarf_35cab2_020d3388)[uVar11];
              }
              sVar8 = strlen(pcVar10);
              poVar1 = (ostringstream *)(local_1b0 + 8);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,pcVar10,sVar8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar1,". Query was done for target ",0x1c);
              sVar8 = strlen(pcVar9);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,pcVar9,sVar8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar1,", and the test was prepared to ",0x1f);
              pcVar10 = "discard";
              if (bVar3 != false) {
                pcVar10 = "pass";
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar1,pcVar10,(ulong)(bVar3 ^ 1) * 3 + 4);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar1," all fragments.",0xf);
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
              std::__cxx11::ostringstream::~ostringstream(poVar1);
              std::ios_base::~ios_base(local_138);
              goto LAB_0091aad8;
            }
          }
          else {
LAB_0091aad8:
            bVar4 = false;
          }
          iVar7 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
          if (this->m_qo_id != 0) {
            (**(code **)(CONCAT44(extraout_var_00,iVar7) + 0x458))(1);
            this->m_qo_id = 0;
          }
          lVar12 = lVar12 + 4;
        } while (lVar12 != 0x10);
        local_1c0 = 1;
        bVar6 = true;
        bVar3 = false;
      } while (bVar2);
      local_1c8 = 1;
      bVar3 = false;
    } while (bVar5);
    cleanProgramViewAndVAO(this);
    if (!bVar4) {
      local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
      poVar1 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"The Conditional Render Inverted Functional Test has failed.",
                 0x3b);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_138);
      this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
      pcVar9 = "Fail.";
      testResult = QP_TEST_RESULT_FAIL;
      goto LAB_0091acc5;
    }
  }
  else {
    cleanProgramViewAndVAO(this);
  }
  this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
  pcVar9 = "Pass";
  testResult = QP_TEST_RESULT_PASS;
LAB_0091acc5:
  tcu::TestContext::setTestResult(this_00,testResult,pcVar9);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult gl4cts::ConditionalRenderInverted::FunctionalTest::iterate()
{
	/* OpenGL support query. */
	bool is_at_least_gl_45 = (glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 5)));
	bool is_arb_conditional_render_inverted =
		m_context.getContextInfo().isExtensionSupported("GL_ARB_conditional_render_inverted");

	/* Running tests. */
	bool is_ok	= true;
	bool is_error = false;

	/* This test should only be executed if we're running a GL4.5 context or related extension is available */
	try
	{
		if (is_at_least_gl_45 || is_arb_conditional_render_inverted)
		{
			/* Test cases. */
			static const bool render_cases[] = { false, true };

			static const glw::GLuint render_cases_count = sizeof(render_cases) / sizeof(render_cases[0]);

			static const glw::GLenum query_cases[] = { GL_SAMPLES_PASSED, GL_ANY_SAMPLES_PASSED };

			static const glw::GLuint query_cases_count = sizeof(query_cases) / sizeof(query_cases[0]);

			static const glw::GLenum modes[] = { GL_QUERY_WAIT_INVERTED, GL_QUERY_NO_WAIT_INVERTED,
												 GL_QUERY_BY_REGION_WAIT_INVERTED,
												 GL_QUERY_BY_REGION_NO_WAIT_INVERTED };

			static const glw::GLuint modes_count = sizeof(modes) / sizeof(modes[0]);

			/* Creating common objects. */
			createProgram();
			createView();
			createVertexArrayObject();

			/* Iterating over test cases. */
			for (glw::GLuint i = 0; i < render_cases_count; ++i)
			{
				for (glw::GLuint j = 0; j < query_cases_count; ++j)
				{
					for (glw::GLuint k = 0; k < modes_count; ++k)
					{
						createQueryObject();

						setupColor(1.f);
						setupPassSwitch(render_cases[i]);
						clearView();
						draw(false, query_cases[j]);

						if (render_cases[i] == fragmentsPassed())
						{
							setupColor(0.f);
							setupPassSwitch(true);
							draw(true, modes[k]);

							glw::GLfloat expected_value = (render_cases[i]) ? 1.f : 0.f;
							glw::GLfloat resulted_value = readPixel();

							if (de::abs(expected_value - resulted_value) > 0.0078125f /* Precission (1/128) */)
							{
								m_context.getTestContext().getLog()
									<< tcu::TestLog::Message << "The functional test's expected value ("
									<< expected_value << ") is different than resulted value (" << resulted_value
									<< "). The tested mode was " << Utilities::modeToChars(modes[k])
									<< ". Query was done for target " << Utilities::queryTargetToChars(query_cases[j])
									<< ", and the test was prepared to " << ((render_cases[i]) ? "pass" : "discard")
									<< " all fragments." << tcu::TestLog::EndMessage;

								is_ok = false;
							}
						}
						else
						{
							is_ok = false;
						}

						cleanQueryObject();
					}
				}
			}
		}
	}
	catch (...)
	{
		is_ok	= false;
		is_error = true;

		cleanQueryObject();
	}

	/* Clean-up. */
	cleanProgramViewAndVAO();

	/* Result's setup. */
	if (is_ok)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		if (is_error)
		{
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message
				<< "Internal error has occured during Conditional Render Inverted Functional Test."
				<< tcu::TestLog::EndMessage;

			m_testCtx.setTestResult(QP_TEST_RESULT_INTERNAL_ERROR, "Test error.");
		}
		else
		{
			m_context.getTestContext().getLog() << tcu::TestLog::Message
												<< "The Conditional Render Inverted Functional Test has failed."
												<< tcu::TestLog::EndMessage;

			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail.");
		}
	}

	return STOP;
}